

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_zeropage_x_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_336244::NopZeroXFixture_nop_zerox_Test::TestBody
          (NopZeroXFixture_nop_zerox_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  undefined2 uVar2;
  int iVar3;
  ParamType *pPVar4;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar5;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar6;
  char cVar7;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_90;
  code *local_80;
  int *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  MatcherBase<unsigned_short> local_58;
  MatcherBase<unsigned_short> local_40;
  
  pPVar4 = testing::WithParamInterface<unsigned_char>::GetParam();
  n_e_s::core::test::CpuTest::stage_instruction((CpuTest *)this,*pPVar4);
  (this->super_NopZeroXFixture).super_CpuTest.registers.x = '\x01';
  (this->super_NopZeroXFixture).super_CpuTest.expected.x = '\x01';
  pCVar1 = &(this->super_NopZeroXFixture).super_CpuTest.expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_NopZeroXFixture).super_CpuTest.mmu;
  uVar2 = (this->super_NopZeroXFixture).super_CpuTest.registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,uVar2 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
                      ,0x13,"mmu","read_byte(registers.pc + 1)");
  local_70 = (int *)operator_new(4);
  *local_70 = 0xcd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_68,local_70);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *local_70;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0xcd);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
                      ,0x14,"mmu","read_byte(0xCD)");
  local_70 = (int *)operator_new(4);
  *local_70 = 0xfd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_68,local_70);
  pAVar6 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar6->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *local_70;
  *(int *)&pAVar6[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar6[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_90,pAVar6);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar5,(Action<unsigned_char_(unsigned_short)> *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  cVar7 = '\x04';
  do {
    (*(((this->super_NopZeroXFixture).super_CpuTest.cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar7 = cVar7 + -1;
  } while (cVar7 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",
             &(this->super_NopZeroXFixture).super_CpuTest.expected,
             &(this->super_NopZeroXFixture).super_CpuTest.registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_nop_zeropage_x_instructions.cpp"
               ,0x17,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_90._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_90._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_P(NopZeroXFixture, nop_zerox) {
    stage_instruction(GetParam());
    expected.x = registers.x = 0x01;
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(0xCD)).WillOnce(Return(0xFD)); // Dummy read

    step_execution(4);
    EXPECT_EQ(expected, registers);
}